

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O2

int32_t floatx80_to_int32_round_to_zero_aarch64(floatx80 a,float_status *status)

{
  byte bVar1;
  ushort uVar2;
  int32_t iVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  
  uVar6 = a.low;
  uVar2 = a.high;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar6)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -0x80000000;
  }
  bVar1 = a.high._1_1_ >> 7;
  if ((uVar2 & 0x7fff) < 0x401f) {
    if ((uVar2 & 0x7fff) < 0x3fff) {
      iVar3 = 0;
      if (uVar6 == 0 && ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
        return 0;
      }
    }
    else {
      bVar5 = 0x3e - (char)a.high;
      uVar8 = uVar6 >> (bVar5 & 0x3f);
      uVar4 = (ulong)(uint)-(int)uVar8;
      if (-1 < (short)uVar2) {
        uVar4 = uVar8 & 0xffffffff;
      }
      iVar3 = (int32_t)uVar4;
      bVar7 = bVar1;
      if ((uint)(uVar4 >> 0x1f) != (uint)(uVar2 >> 0xf)) goto LAB_0058369d;
      if (uVar8 << (bVar5 & 0x3f) == uVar6) {
        return iVar3;
      }
    }
    status->float_exception_flags = status->float_exception_flags | 0x20;
    return iVar3;
  }
  bVar7 = 0;
  if ((uVar2 & 0x7fff) != 0x7fff) {
    bVar7 = a.high._1_1_ >> 7;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
    bVar7 = bVar1;
  }
LAB_0058369d:
  status->float_exception_flags = status->float_exception_flags | 1;
  return -0x80000000 - (uint)(bVar7 == 0);
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}